

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hotring.cpp
# Opt level: O2

htEntry * __thiscall HotRingInstance::HotRing::search(HotRing *this,string *key)

{
  bool bVar1;
  __type _Var2;
  size_t sVar3;
  ulong uVar4;
  htEntry *phVar5;
  htEntry *phVar6;
  size_t sVar7;
  string *psVar8;
  hrHead *this_00;
  ulong uVar9;
  htEntry compareItem;
  allocator<char> local_b1;
  string *local_b0;
  size_t local_a8;
  string local_a0;
  htEntry local_80;
  
  sVar3 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&hash_fn_abi_cxx11_,key);
  uVar9 = this->hash_mask;
  local_a8 = this->findcnt;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_b1);
  uVar4 = uVar9 - (uVar9 >> 1 & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  local_b0 = key;
  htEntry::htEntry(&local_80,key,&local_a0,(htEntry *)0x0,
                   (~uVar9 & sVar3) >>
                   ((byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) &
                   0x3f));
  uVar9 = uVar9 & sVar3;
  std::__cxx11::string::~string((string *)&local_a0);
  this->r = this->r + 1;
  hrHead::inc_counter((this->table).
                      super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar9);
  phVar5 = hrHead::get_head((this->table).
                            super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar9);
  if (phVar5 != (htEntry *)0x0) {
    phVar5 = hrHead::get_head((this->table).
                              super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar9);
    phVar5 = htEntry::get_next(phVar5);
    phVar6 = hrHead::get_head((this->table).
                              super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar9);
    this_00 = (this->table).
              super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar9;
    if (phVar5 != phVar6) {
      phVar5 = hrHead::get_head(this_00);
      bVar1 = hrHead::get_active((this->table).
                                 super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar9);
      if (bVar1) {
        htEntry::inc_counter(phVar5);
      }
      phVar6 = hrHead::get_head((this->table).
                                super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar9);
      phVar6 = htEntry::get_next(phVar6);
      do {
        sVar3 = htEntry::get_tag(&local_80);
        sVar7 = htEntry::get_tag(phVar5);
        if (sVar3 == sVar7) {
          psVar8 = htEntry::get_key_abi_cxx11_(phVar5);
          _Var2 = std::operator==(local_b0,psVar8);
          if (_Var2) {
            if (4 < this->r) {
              phVar6 = hrHead::get_head((this->table).
                                        super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar9);
              if (phVar5 != phVar6) {
                bVar1 = hrHead::get_active((this->table).
                                           super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar9);
                if (bVar1) {
                  hotspot_movement(this,uVar9);
                  hrHead::reset_active
                            ((this->table).
                             super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar9);
                  hrHead::reset_counter
                            ((this->table).
                             super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar9);
                }
                else {
                  hrHead::set_active((this->table).
                                     super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar9);
                }
                this->r = 0;
              }
            }
            goto LAB_00102ec1;
          }
        }
        bVar1 = htEntry::operator<(phVar5,&local_80);
        if (bVar1) {
          bVar1 = htEntry::operator<(&local_80,phVar6);
          if (bVar1) goto LAB_00102ebe;
        }
        bVar1 = htEntry::operator<(&local_80,phVar6);
        if (bVar1) {
          bVar1 = htEntry::operator<(phVar6,phVar5);
          if (bVar1) goto LAB_00102ebe;
        }
        bVar1 = htEntry::operator<(phVar6,phVar5);
        if (bVar1) {
          bVar1 = htEntry::operator<(phVar5,&local_80);
          if (bVar1) goto LAB_00102ebe;
        }
        phVar6 = htEntry::get_next(phVar6);
        phVar5 = htEntry::get_next(phVar5);
        this->findcnt = this->findcnt + 1;
      } while( true );
    }
    phVar5 = hrHead::get_head(this_00);
    psVar8 = htEntry::get_key_abi_cxx11_(phVar5);
    _Var2 = std::operator==(psVar8,local_b0);
    if (_Var2) {
      phVar5 = hrHead::get_head((this->table).
                                super__Vector_base<HotRingInstance::hrHead,_std::allocator<HotRingInstance::hrHead>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar9);
      goto LAB_00102ec1;
    }
  }
LAB_00102ebe:
  phVar5 = (htEntry *)0x0;
LAB_00102ec1:
  sVar3 = this->findcnt + 1;
  this->findcnt = sVar3;
  uVar9 = sVar3 - local_a8;
  uVar4 = this->maxFindcnt;
  if (this->maxFindcnt <= uVar9) {
    uVar4 = uVar9;
  }
  this->maxFindcnt = uVar4;
  if (this->minFindcnt < uVar9) {
    uVar9 = this->minFindcnt;
  }
  this->minFindcnt = uVar9;
  htEntry::~htEntry(&local_80);
  return phVar5;
}

Assistant:

htEntry* HotRing::search(const string &key){
        size_t hashValue = hash_fn(key);
        size_t index = hashValue & hash_mask;
        size_t tag = (hashValue & (~hash_mask)) >> __builtin_popcountl(hash_mask);

        htEntry* pre = nullptr;
        htEntry* nxt = nullptr;
        htEntry* res = nullptr;

        size_t precnt = findcnt;
        htEntry compareItem(key, "", nullptr, tag);
        bool hotspotAware = false;

        using namespace std;
        //std::cout << key << " : " << index << std::endl; 

        // 在每R个请求完成之后，我们确定是否启动新一轮采样，设置active状态。
        // 如果第R次访问是热访问，则意味着当前热点标识仍然准确，并且无需触发采样
        ++this->r;
        table[index].inc_counter(); // 整个环的访问数加1

        if(table[index].get_head() == nullptr){ // 环中没有元素
            res = nullptr;
        } else if(table[index].get_head()->get_next() == table[index].get_head()){  // 环中有一个元素
            if(table[index].get_head()->get_key() == key){
                res = table[index].get_head();
                if(r >= R){ // 第一个if可能导致加到等于R时没有任何行为，所以这里h和后面需要大于等于R
                    // 只有一个元素，它本身当然就是热点了，所以不需要触发采样
                    r == 0;
                }
            }
        } else {    // 环中有很多元素
            //cout << "第三个if\n";
            pre = table[index].get_head();

            if(table[index].get_active()){ // 3.2.2，active标志存在才进行采样
                pre->inc_counter(); 
            }
            nxt = table[index].get_head()->get_next();
            while (true) {
                if(compareItem.get_tag() == pre->get_tag() && key == pre->get_key()){
                    res = pre;
                    if(r >= R && pre != table[index].get_head()){   // 第R次访问不是热结点，开启采样;当热点调整的时候重置
                        if(table[index].get_active()){  // 保证在设置后的第R次进行热点调整
                            hotspot_movement(index);    // 其中清空了每个数据项的统计信息
                            table[index].reset_active();
                            table[index].reset_counter();
                        } else {
                            table[index].set_active();
                        }
                        r = 0;
                    }
                    break;
                }

                if (((*pre) < (&compareItem) && (compareItem) < (nxt)) ||       //ordre_i-1 < order_k < order_i
                    ((compareItem) < (nxt) && (*nxt) < (pre))     ||            //order_k < order_i < order_i-1 小于有序环最小值
                    ((*nxt) < (pre) && (*pre) < (&compareItem)))                //order_i < order_i-1 < order_k 大于有序环最大值
                {
                    break;
                }
                nxt = nxt->get_next();
                pre = pre->get_next();
                ++findcnt;
            }
        }
        ++findcnt;  // 在正常的循环的地方递增，也就是向上数两行的作用;这一行的作用是查找成功和查找失败的那一个加1，放上面就得写好多个加1

        set_min_max(findcnt - precnt);
        return res;
    }